

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O0

uint8_t * __thiscall
google::protobuf::MethodDescriptorProto::_InternalSerialize
          (MethodDescriptorProto *this,uint8_t *target,EpsCopyOutputStream *stream)

{
  MethodOptions *value;
  MethodDescriptorProto *pMVar1;
  bool bVar2;
  int iVar3;
  uint32_t *puVar4;
  char *pcVar5;
  UnknownFieldSet *unknown_fields;
  string_view sVar6;
  string_view local_98;
  string *local_88;
  string *_s_2;
  char *local_78;
  string_view local_70;
  string *local_60;
  string *_s_1;
  char *local_50;
  string_view local_48;
  string *local_38;
  string *_s;
  MethodDescriptorProto *pMStack_28;
  uint32_t cached_has_bits;
  MethodDescriptorProto *this_;
  EpsCopyOutputStream *stream_local;
  uint8_t *target_local;
  MethodDescriptorProto *this_local;
  
  _s._4_4_ = 0;
  pMStack_28 = this;
  this_ = (MethodDescriptorProto *)stream;
  stream_local = (EpsCopyOutputStream *)target;
  target_local = (uint8_t *)this;
  puVar4 = internal::HasBits<1>::operator[](&(this->field_0)._impl_._has_bits_,0);
  _s._4_4_ = *puVar4;
  if ((_s._4_4_ & 1) != 0) {
    local_38 = _internal_name_abi_cxx11_(pMStack_28);
    pcVar5 = (char *)std::__cxx11::string::data();
    iVar3 = std::__cxx11::string::length();
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_48,"google.protobuf.MethodDescriptorProto.name");
    internal::WireFormat::VerifyUTF8StringNamedField(pcVar5,iVar3,SERIALIZE,local_48);
    pMVar1 = this_;
    sVar6 = (string_view)
            std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_38);
    local_50 = sVar6._M_str;
    _s_1 = (string *)sVar6._M_len;
    stream_local = (EpsCopyOutputStream *)
                   io::EpsCopyOutputStream::WriteStringMaybeAliased
                             ((EpsCopyOutputStream *)pMVar1,1,sVar6,(uint8_t *)stream_local);
  }
  if ((_s._4_4_ & 2) != 0) {
    local_60 = _internal_input_type_abi_cxx11_(pMStack_28);
    pcVar5 = (char *)std::__cxx11::string::data();
    iVar3 = std::__cxx11::string::length();
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_70,"google.protobuf.MethodDescriptorProto.input_type");
    internal::WireFormat::VerifyUTF8StringNamedField(pcVar5,iVar3,SERIALIZE,local_70);
    pMVar1 = this_;
    sVar6 = (string_view)
            std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_60);
    local_78 = sVar6._M_str;
    _s_2 = (string *)sVar6._M_len;
    stream_local = (EpsCopyOutputStream *)
                   io::EpsCopyOutputStream::WriteStringMaybeAliased
                             ((EpsCopyOutputStream *)pMVar1,2,sVar6,(uint8_t *)stream_local);
  }
  if ((_s._4_4_ & 4) != 0) {
    local_88 = _internal_output_type_abi_cxx11_(pMStack_28);
    pcVar5 = (char *)std::__cxx11::string::data();
    iVar3 = std::__cxx11::string::length();
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_98,"google.protobuf.MethodDescriptorProto.output_type");
    internal::WireFormat::VerifyUTF8StringNamedField(pcVar5,iVar3,SERIALIZE,local_98);
    pMVar1 = this_;
    sVar6 = (string_view)
            std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_88);
    stream_local = (EpsCopyOutputStream *)
                   io::EpsCopyOutputStream::WriteStringMaybeAliased
                             ((EpsCopyOutputStream *)pMVar1,3,sVar6,(uint8_t *)stream_local);
  }
  if ((_s._4_4_ & 8) != 0) {
    value = (pMStack_28->field_0)._impl_.options_;
    iVar3 = MethodOptions::GetCachedSize((pMStack_28->field_0)._impl_.options_);
    stream_local = (EpsCopyOutputStream *)
                   internal::WireFormatLite::InternalWriteMessage
                             (4,(MessageLite *)value,iVar3,(uint8_t *)stream_local,
                              (EpsCopyOutputStream *)this_);
  }
  if ((_s._4_4_ & 0x10) != 0) {
    stream_local = (EpsCopyOutputStream *)
                   io::EpsCopyOutputStream::EnsureSpace
                             ((EpsCopyOutputStream *)this_,(uint8_t *)stream_local);
    bVar2 = _internal_client_streaming(pMStack_28);
    stream_local = (EpsCopyOutputStream *)
                   internal::WireFormatLite::WriteBoolToArray(5,bVar2,(uint8_t *)stream_local);
  }
  if ((_s._4_4_ & 0x20) != 0) {
    stream_local = (EpsCopyOutputStream *)
                   io::EpsCopyOutputStream::EnsureSpace
                             ((EpsCopyOutputStream *)this_,(uint8_t *)stream_local);
    bVar2 = _internal_server_streaming(pMStack_28);
    stream_local = (EpsCopyOutputStream *)
                   internal::WireFormatLite::WriteBoolToArray(6,bVar2,(uint8_t *)stream_local);
  }
  bVar2 = internal::InternalMetadata::have_unknown_fields
                    (&(pMStack_28->super_Message).super_MessageLite._internal_metadata_);
  if (bVar2) {
    unknown_fields =
         internal::InternalMetadata::unknown_fields<google::protobuf::UnknownFieldSet>
                   (&(pMStack_28->super_Message).super_MessageLite._internal_metadata_,
                    UnknownFieldSet::default_instance);
    stream_local = (EpsCopyOutputStream *)
                   internal::WireFormat::InternalSerializeUnknownFieldsToArray
                             (unknown_fields,(uint8_t *)stream_local,(EpsCopyOutputStream *)this_);
  }
  return (uint8_t *)stream_local;
}

Assistant:

::uint8_t* PROTOBUF_NONNULL MethodDescriptorProto::_InternalSerialize(
    ::uint8_t* PROTOBUF_NONNULL target,
    ::google::protobuf::io::EpsCopyOutputStream* PROTOBUF_NONNULL stream) const {
  const MethodDescriptorProto& this_ = *this;
#endif  // PROTOBUF_CUSTOM_VTABLE
  // @@protoc_insertion_point(serialize_to_array_start:google.protobuf.MethodDescriptorProto)
  ::uint32_t cached_has_bits = 0;
  (void)cached_has_bits;

  cached_has_bits = this_._impl_._has_bits_[0];
  // optional string name = 1;
  if ((cached_has_bits & 0x00000001u) != 0) {
    const ::std::string& _s = this_._internal_name();
    ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(_s.data(), static_cast<int>(_s.length()), ::google::protobuf::internal::WireFormat::SERIALIZE,
                                "google.protobuf.MethodDescriptorProto.name");
    target = stream->WriteStringMaybeAliased(1, _s, target);
  }

  // optional string input_type = 2;
  if ((cached_has_bits & 0x00000002u) != 0) {
    const ::std::string& _s = this_._internal_input_type();
    ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(_s.data(), static_cast<int>(_s.length()), ::google::protobuf::internal::WireFormat::SERIALIZE,
                                "google.protobuf.MethodDescriptorProto.input_type");
    target = stream->WriteStringMaybeAliased(2, _s, target);
  }

  // optional string output_type = 3;
  if ((cached_has_bits & 0x00000004u) != 0) {
    const ::std::string& _s = this_._internal_output_type();
    ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(_s.data(), static_cast<int>(_s.length()), ::google::protobuf::internal::WireFormat::SERIALIZE,
                                "google.protobuf.MethodDescriptorProto.output_type");
    target = stream->WriteStringMaybeAliased(3, _s, target);
  }

  // optional .google.protobuf.MethodOptions options = 4;
  if ((cached_has_bits & 0x00000008u) != 0) {
    target = ::google::protobuf::internal::WireFormatLite::InternalWriteMessage(
        4, *this_._impl_.options_, this_._impl_.options_->GetCachedSize(), target,
        stream);
  }

  // optional bool client_streaming = 5 [default = false];
  if ((cached_has_bits & 0x00000010u) != 0) {
    target = stream->EnsureSpace(target);
    target = ::_pbi::WireFormatLite::WriteBoolToArray(
        5, this_._internal_client_streaming(), target);
  }

  // optional bool server_streaming = 6 [default = false];
  if ((cached_has_bits & 0x00000020u) != 0) {
    target = stream->EnsureSpace(target);
    target = ::_pbi::WireFormatLite::WriteBoolToArray(
        6, this_._internal_server_streaming(), target);
  }

  if (ABSL_PREDICT_FALSE(this_._internal_metadata_.have_unknown_fields())) {
    target =
        ::_pbi::WireFormat::InternalSerializeUnknownFieldsToArray(
            this_._internal_metadata_.unknown_fields<::google::protobuf::UnknownFieldSet>(::google::protobuf::UnknownFieldSet::default_instance), target, stream);
  }
  // @@protoc_insertion_point(serialize_to_array_end:google.protobuf.MethodDescriptorProto)
  return target;
}